

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::peer_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_error_alert *this)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  error_category *peVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  allocator<char> local_155 [13];
  string local_148;
  string local_128;
  string local_108;
  char local_e8 [8];
  char buf [200];
  peer_error_alert *this_local;
  
  peer_alert::message_abi_cxx11_(&local_108,&this->super_peer_alert);
  uVar2 = std::__cxx11::string::c_str();
  pcVar3 = operation_name((this->super_peer_alert).field_0x9c);
  peVar4 = boost::system::error_code::category(&this->error);
  iVar1 = (**peVar4->_vptr_error_category)();
  boost::system::error_code::message_abi_cxx11_(&local_148,&this->error);
  convert_from_native(&local_128,&local_148);
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_e8,200,"%s peer error [%s] [%s]: %s",uVar2,pcVar3,CONCAT44(extraout_var,iVar1),
           uVar5);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,local_155);
  std::allocator<char>::~allocator(local_155);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_error_alert::message() const
	{
		char buf[200];
		std::snprintf(buf, sizeof(buf), "%s peer error [%s] [%s]: %s"
			, peer_alert::message().c_str()
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str());
		return buf;
	}